

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3DoclistOrMerge(int bDescDoclist,char *a1,int n1,char *a2,int n2,char **paOut,int *pnOut)

{
  byte *pbVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  byte *pbVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  size_t sVar13;
  long lVar14;
  byte *pbVar15;
  byte *pbVar16;
  byte *pbVar17;
  sqlite3_int64 iVal;
  long local_78;
  byte *local_70;
  byte *local_68;
  byte *local_60;
  long local_58;
  byte *local_50;
  byte *local_48;
  byte *local_40;
  char **local_38;
  
  local_58 = CONCAT44(local_58._4_4_,n1);
  *paOut = (char *)0x0;
  *pnOut = 0;
  iVar5 = sqlite3_initialize();
  iVar6 = 7;
  if (iVar5 == 0) {
    lVar14 = (long)(int)local_58;
    local_50 = (byte *)a1;
    local_48 = (byte *)a2;
    local_70 = (byte *)sqlite3Malloc(n2 + lVar14 + 0x11);
    pbVar17 = local_50;
    if (local_70 != (byte *)0x0) {
      local_40 = local_70;
      local_38 = paOut;
      if ((int)local_58 < 1) {
        pbVar17 = (byte *)0x0;
        lVar9 = 0;
      }
      else {
        iVar5 = sqlite3Fts3GetVarint((char *)local_50,&local_78);
        pbVar17 = pbVar17 + iVar5;
        lVar9 = local_78;
      }
      pbVar16 = local_48;
      local_60 = pbVar17;
      if (n2 < 1) {
        pbVar16 = (byte *)0x0;
        lVar11 = 0;
      }
      else {
        iVar5 = sqlite3Fts3GetVarint((char *)local_48,&local_78);
        pbVar16 = pbVar16 + iVar5;
        lVar11 = local_78;
      }
      pbVar15 = local_40;
      if (pbVar17 != (byte *)0x0 || pbVar16 != (byte *)0x0) {
        local_50 = local_50 + lVar14;
        local_48 = local_48 + n2;
        bVar2 = true;
        lVar14 = 0;
        local_68 = pbVar16;
        do {
          lVar12 = -(lVar9 - lVar11);
          if (bDescDoclist == 0) {
            lVar12 = lVar9 - lVar11;
          }
          if (((pbVar17 == (byte *)0x0) || (pbVar16 == (byte *)0x0)) || (lVar12 != 0)) {
            local_58 = lVar11;
            if ((pbVar16 == (byte *)0x0) || (pbVar17 != (byte *)0x0 && lVar12 < 0)) {
              uVar7 = lVar14 - lVar9;
              if (bDescDoclist == 0 || bVar2) {
                uVar7 = lVar9 - lVar14;
              }
              do {
                pbVar15 = local_70;
                bVar3 = (byte)uVar7;
                *pbVar15 = bVar3 | 0x80;
                pbVar8 = pbVar15 + 1;
                bVar2 = 0x7f < uVar7;
                uVar7 = uVar7 >> 7;
                local_70 = pbVar8;
              } while (bVar2);
              *pbVar15 = bVar3;
              bVar3 = *pbVar17;
              pbVar15 = pbVar17;
              if (bVar3 != 0) {
                do {
                  pbVar1 = pbVar15 + 1;
                  pbVar15 = pbVar15 + 1;
                  bVar4 = bVar3 & 0x80;
                  bVar3 = *pbVar1;
                } while (bVar4 != 0 || *pbVar1 != 0);
              }
              pbVar15 = pbVar15 + 1;
              sVar13 = (size_t)((int)pbVar15 - (int)pbVar17);
              memcpy(pbVar8,pbVar17,sVar13);
              local_70 = pbVar8 + sVar13;
              if (pbVar15 < local_50) {
                local_60 = pbVar15;
                iVar5 = sqlite3Fts3GetVarint((char *)pbVar15,&local_78);
                pbVar17 = local_60 + iVar5;
                lVar12 = -local_78;
                if (bDescDoclist == 0) {
                  lVar12 = local_78;
                }
                lVar14 = lVar9;
                lVar11 = local_58;
                lVar9 = lVar12 + lVar9;
                pbVar16 = local_68;
                local_60 = pbVar17;
              }
              else {
                local_60 = (byte *)0x0;
                pbVar17 = (byte *)0x0;
                lVar14 = lVar9;
                lVar11 = local_58;
              }
            }
            else {
              uVar7 = lVar14 - lVar11;
              if ((bool)(bDescDoclist == 0 | bVar2)) {
                uVar7 = lVar11 - lVar14;
              }
              do {
                pbVar15 = local_70;
                bVar3 = (byte)uVar7;
                *pbVar15 = bVar3 | 0x80;
                pbVar8 = pbVar15 + 1;
                bVar2 = 0x7f < uVar7;
                uVar7 = uVar7 >> 7;
                local_70 = pbVar8;
              } while (bVar2);
              *pbVar15 = bVar3;
              bVar3 = *pbVar16;
              pbVar15 = pbVar16;
              if (bVar3 != 0) {
                do {
                  pbVar1 = pbVar15 + 1;
                  pbVar15 = pbVar15 + 1;
                  bVar4 = bVar3 & 0x80;
                  bVar3 = *pbVar1;
                } while (bVar4 != 0 || *pbVar1 != 0);
              }
              pbVar15 = pbVar15 + 1;
              sVar13 = (size_t)((int)pbVar15 - (int)pbVar16);
              memcpy(pbVar8,pbVar16,sVar13);
              local_70 = pbVar8 + sVar13;
              if (pbVar15 < local_48) {
                local_68 = pbVar15;
                iVar5 = sqlite3Fts3GetVarint((char *)pbVar15,&local_78);
                local_68 = local_68 + iVar5;
                lVar11 = -local_78;
                if (bDescDoclist == 0) {
                  lVar11 = local_78;
                }
                lVar14 = local_58;
                lVar11 = lVar11 + local_58;
                pbVar16 = local_68;
                pbVar17 = local_60;
              }
              else {
                local_68 = (byte *)0x0;
                pbVar16 = (byte *)0x0;
                lVar14 = local_58;
                lVar11 = local_58;
              }
            }
          }
          else {
            uVar7 = lVar14 - lVar9;
            if (bVar2) {
              uVar7 = lVar9 - lVar14;
            }
            if (bDescDoclist == 0) {
              uVar7 = lVar9 - lVar14;
            }
            do {
              pbVar17 = local_70;
              bVar3 = (byte)uVar7;
              *pbVar17 = bVar3 | 0x80;
              local_70 = pbVar17 + 1;
              bVar2 = 0x7f < uVar7;
              uVar7 = uVar7 >> 7;
            } while (bVar2);
            *pbVar17 = bVar3;
            iVar6 = fts3PoslistMerge((char **)&local_70,(char **)&local_60,(char **)&local_68);
            pbVar17 = local_60;
            if (iVar6 != 0) {
              sqlite3_free(local_40);
              pbVar15 = (byte *)0x0;
              local_40 = (byte *)0x0;
              goto LAB_001beb8b;
            }
            if (local_60 < local_50) {
              iVar5 = sqlite3Fts3GetVarint((char *)local_60,&local_78);
              pbVar17 = pbVar17 + iVar5;
              lVar14 = -local_78;
              if (bDescDoclist == 0) {
                lVar14 = local_78;
              }
              lVar12 = lVar14 + lVar9;
            }
            else {
              pbVar17 = (byte *)0x0;
              lVar12 = lVar9;
            }
            pbVar16 = local_68;
            local_60 = pbVar17;
            if (local_68 < local_48) {
              iVar5 = sqlite3Fts3GetVarint((char *)local_68,&local_78);
              local_68 = pbVar16 + iVar5;
              lVar10 = -local_78;
              if (bDescDoclist == 0) {
                lVar10 = local_78;
              }
              lVar14 = lVar9;
              lVar11 = lVar10 + lVar11;
              lVar9 = lVar12;
              pbVar16 = local_68;
            }
            else {
              local_68 = (byte *)0x0;
              pbVar16 = (byte *)0x0;
              lVar14 = lVar9;
              lVar9 = lVar12;
            }
          }
          bVar2 = false;
          pbVar15 = local_70;
        } while (pbVar17 != (byte *)0x0 || pbVar16 != (byte *)0x0);
      }
      pbVar15[0] = 0;
      pbVar15[1] = 0;
      pbVar15[2] = 0;
      pbVar15[3] = 0;
      pbVar15[4] = 0;
      pbVar15[5] = 0;
      pbVar15[6] = 0;
      pbVar15[7] = 0;
      iVar6 = 0;
LAB_001beb8b:
      *local_38 = (char *)local_40;
      *pnOut = (int)pbVar15 - (int)local_40;
    }
  }
  return iVar6;
}

Assistant:

static int fts3DoclistOrMerge(
  int bDescDoclist,               /* True if arguments are desc */
  char *a1, int n1,               /* First doclist */
  char *a2, int n2,               /* Second doclist */
  char **paOut, int *pnOut        /* OUT: Malloc'd doclist */
){
  int rc = SQLITE_OK;
  sqlite3_int64 i1 = 0;
  sqlite3_int64 i2 = 0;
  sqlite3_int64 iPrev = 0;
  char *pEnd1 = &a1[n1];
  char *pEnd2 = &a2[n2];
  char *p1 = a1;
  char *p2 = a2;
  char *p;
  char *aOut;
  int bFirstOut = 0;

  *paOut = 0;
  *pnOut = 0;

  /* Allocate space for the output. Both the input and output doclists
  ** are delta encoded. If they are in ascending order (bDescDoclist==0),
  ** then the first docid in each list is simply encoded as a varint. For
  ** each subsequent docid, the varint stored is the difference between the
  ** current and previous docid (a positive number - since the list is in
  ** ascending order).
  **
  ** The first docid written to the output is therefore encoded using the 
  ** same number of bytes as it is in whichever of the input lists it is
  ** read from. And each subsequent docid read from the same input list 
  ** consumes either the same or less bytes as it did in the input (since
  ** the difference between it and the previous value in the output must
  ** be a positive value less than or equal to the delta value read from 
  ** the input list). The same argument applies to all but the first docid
  ** read from the 'other' list. And to the contents of all position lists
  ** that will be copied and merged from the input to the output.
  **
  ** However, if the first docid copied to the output is a negative number,
  ** then the encoding of the first docid from the 'other' input list may
  ** be larger in the output than it was in the input (since the delta value
  ** may be a larger positive integer than the actual docid).
  **
  ** The space required to store the output is therefore the sum of the
  ** sizes of the two inputs, plus enough space for exactly one of the input
  ** docids to grow. 
  **
  ** A symetric argument may be made if the doclists are in descending 
  ** order.
  */
  aOut = sqlite3_malloc64((i64)n1+n2+FTS3_VARINT_MAX-1+FTS3_BUFFER_PADDING);
  if( !aOut ) return SQLITE_NOMEM;

  p = aOut;
  fts3GetDeltaVarint3(&p1, pEnd1, 0, &i1);
  fts3GetDeltaVarint3(&p2, pEnd2, 0, &i2);
  while( p1 || p2 ){
    sqlite3_int64 iDiff = DOCID_CMP(i1, i2);

    if( p2 && p1 && iDiff==0 ){
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i1);
      rc = fts3PoslistMerge(&p, &p1, &p2);
      if( rc ) break;
      fts3GetDeltaVarint3(&p1, pEnd1, bDescDoclist, &i1);
      fts3GetDeltaVarint3(&p2, pEnd2, bDescDoclist, &i2);
    }else if( !p2 || (p1 && iDiff<0) ){
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i1);
      fts3PoslistCopy(&p, &p1);
      fts3GetDeltaVarint3(&p1, pEnd1, bDescDoclist, &i1);
    }else{
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i2);
      fts3PoslistCopy(&p, &p2);
      fts3GetDeltaVarint3(&p2, pEnd2, bDescDoclist, &i2);
    }
  }

  if( rc!=SQLITE_OK ){
    sqlite3_free(aOut);
    p = aOut = 0;
  }else{
    assert( (p-aOut)<=n1+n2+FTS3_VARINT_MAX-1 );
    memset(&aOut[(p-aOut)], 0, FTS3_BUFFER_PADDING);
  }
  *paOut = aOut;
  *pnOut = (int)(p-aOut);
  return rc;
}